

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

void Ivy_ObjDeleteFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanout)

{
  Ivy_Obj_t **ppIVar1;
  Ivy_Obj_t **ppIVar2;
  Ivy_Obj_t **ppIVar3;
  Ivy_Obj_t **ppPlaceN;
  Ivy_Obj_t **ppPlace2;
  Ivy_Obj_t **ppPlace1;
  Ivy_Obj_t *pFanout_local;
  Ivy_Obj_t *pFanin_local;
  Ivy_Man_t *p_local;
  
  if (pFanin->pFanout == (Ivy_Obj_t *)0x0) {
    __assert_fail("pFanin->pFanout != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                  ,0xd0,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  ppIVar1 = Ivy_ObjNextFanoutPlace(pFanin,pFanout);
  ppIVar2 = Ivy_ObjPrevNextFanoutPlace(pFanin,pFanout);
  if (*ppIVar2 == pFanout) {
    if (ppIVar2 != (Ivy_Obj_t **)0x0) {
      *ppIVar2 = *ppIVar1;
    }
    ppIVar2 = Ivy_ObjPrevFanoutPlace(pFanin,pFanout);
    ppIVar3 = Ivy_ObjNextPrevFanoutPlace(pFanin,pFanout);
    if ((ppIVar3 != (Ivy_Obj_t **)0x0) && (*ppIVar3 != pFanout)) {
      __assert_fail("ppPlaceN == NULL || *ppPlaceN == pFanout",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                    ,0xda,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    if (ppIVar3 != (Ivy_Obj_t **)0x0) {
      *ppIVar3 = *ppIVar2;
    }
    *ppIVar1 = (Ivy_Obj_t *)0x0;
    *ppIVar2 = (Ivy_Obj_t *)0x0;
    return;
  }
  __assert_fail("*ppPlaceN == pFanout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                ,0xd4,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ObjDeleteFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanout )
{
    Ivy_Obj_t ** ppPlace1, ** ppPlace2, ** ppPlaceN;
    assert( pFanin->pFanout != NULL );

    ppPlace1 = Ivy_ObjNextFanoutPlace(pFanin, pFanout);
    ppPlaceN = Ivy_ObjPrevNextFanoutPlace(pFanin, pFanout);
    assert( *ppPlaceN == pFanout );
    if ( ppPlaceN )
        *ppPlaceN = *ppPlace1;

    ppPlace2 = Ivy_ObjPrevFanoutPlace(pFanin, pFanout);
    ppPlaceN = Ivy_ObjNextPrevFanoutPlace(pFanin, pFanout);
    assert( ppPlaceN == NULL || *ppPlaceN == pFanout );
    if ( ppPlaceN )
        *ppPlaceN = *ppPlace2;

    *ppPlace1 = NULL;
    *ppPlace2 = NULL;
}